

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timernu.c
# Opt level: O3

void al_stop_timer(ALLEGRO_TIMER *timer)

{
  long in_RDI;
  long local_10;
  
  if (*(char *)(in_RDI + 0x80) == '\x01') {
    local_10 = in_RDI;
    al_lock_mutex(timers_mutex);
    _al_vector_find_and_delete(&active_timers,&local_10);
    *(undefined1 *)(local_10 + 0x80) = 0;
    al_unlock_mutex(timers_mutex);
  }
  return;
}

Assistant:

void al_stop_timer(ALLEGRO_TIMER *timer)
{
   ASSERT(timer);
   {
      if (!timer->started)
         return;

      al_lock_mutex(timers_mutex);
      {
         _al_vector_find_and_delete(&active_timers, &timer);
         timer->started = false;
      }
      al_unlock_mutex(timers_mutex);
   }
}